

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findCliqueHeu.cpp
# Opt level: O2

int maxCliqueHeu(CGraphIO *gio)

{
  long lVar1;
  int iVar2;
  int iVar3;
  pointer piVar4;
  pointer piVar5;
  pointer piVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  int j;
  ulong uVar13;
  value_type_conflict1 local_7c;
  vector<int,_std::allocator<int>_> v_i_S1;
  vector<int,_std::allocator<int>_> v_i_S;
  
  maxDegree = gio->m_i_MaximumVertexDegree;
  v_i_S.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  v_i_S.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  v_i_S.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  v_i_S1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  v_i_S1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  v_i_S1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_7c = 0;
  std::vector<int,_std::allocator<int>_>::resize(&v_i_S,(long)maxDegree + 1,&local_7c);
  local_7c = 0;
  std::vector<int,_std::allocator<int>_>::resize(&v_i_S1,(long)maxDegree + 1,&local_7c);
  piVar4 = (gio->m_vi_Vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar5 = (gio->m_vi_Vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar1 = 0;
  iVar8 = -1;
  do {
    do {
      lVar12 = lVar1;
      uVar10 = 1;
      if (((long)piVar5 - (long)piVar4 >> 2) + -1 == lVar12) {
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&v_i_S1.super__Vector_base<int,_std::allocator<int>_>);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&v_i_S.super__Vector_base<int,_std::allocator<int>_>);
        return iVar8;
      }
      lVar1 = lVar12 + 1;
    } while (piVar4[lVar12 + 1] - piVar4[lVar12] < iVar8);
    *v_i_S.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (int)lVar1 + -1;
    iVar7 = piVar4[lVar1];
    piVar6 = (gio->m_vi_Edges).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar12 = (long)piVar4[lVar12]; lVar12 < iVar7; lVar12 = lVar12 + 1) {
      iVar2 = piVar6[lVar12];
      if (iVar8 <= piVar4[(long)iVar2 + 1] - piVar4[iVar2]) {
        iVar9 = (int)uVar10;
        uVar10 = (ulong)(iVar9 + 1);
        v_i_S.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [iVar9] = iVar2;
      }
    }
    iVar7 = 0;
    while (0 < (int)uVar10) {
      iVar2 = v_i_S.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar10 - 1];
      uVar11 = 0;
      for (uVar13 = 0; iVar9 = (int)uVar11, uVar13 != uVar10; uVar13 = uVar13 + 1) {
        for (lVar12 = (long)piVar4[iVar2]; lVar12 < piVar4[(long)iVar2 + 1]; lVar12 = lVar12 + 1) {
          iVar3 = v_i_S.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar13];
          if ((iVar3 == (gio->m_vi_Edges).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar12]) &&
             (iVar8 <= piVar4[(long)iVar3 + 1] - piVar4[iVar3])) {
            uVar11 = (ulong)(iVar9 + 1);
            v_i_S1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar9] = iVar3;
            break;
          }
        }
      }
      uVar10 = 0;
      if (0 < iVar9) {
        uVar10 = uVar11;
      }
      for (uVar13 = 0; uVar10 != uVar13; uVar13 = uVar13 + 1) {
        v_i_S.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [uVar13] = v_i_S1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar13];
      }
      iVar7 = iVar7 + 1;
      uVar10 = uVar11;
    }
    if (iVar8 <= iVar7) {
      iVar8 = iVar7;
    }
  } while( true );
}

Assistant:

int maxCliqueHeu(CGraphIO& gio)
{
	vector <int>* p_v_i_Vertices = gio.GetVerticesPtr();
	vector <int>* p_v_i_Edges = gio.GetEdgesPtr();

	//srand(time(NULL));

	maxDegree = gio.GetMaximumVertexDegree();
	int maxClq = - 1, u, icc;
	vector < int > v_i_S;
	vector < int > v_i_S1;
	v_i_S.resize(maxDegree + 1, 0);
	v_i_S1.resize(maxDegree + 1, 0);

	int iPos, iPos1, iCount, iCount1;

	int notComputed = 0;

	// compute the max clique for each vertex
	for(int iCandidateVertex = 0; iCandidateVertex < p_v_i_Vertices->size() - 1; iCandidateVertex++)
	{
		// Pruning 1
		if(maxClq > ((*p_v_i_Vertices)[iCandidateVertex + 1] - (*p_v_i_Vertices)[iCandidateVertex]))
		{
			notComputed++;
			continue;
		}
		
		iPos = 0;		
		v_i_S[iPos++] = iCandidateVertex;
		int z, imdv = iCandidateVertex, imd = (*p_v_i_Vertices)[iCandidateVertex + 1] - (*p_v_i_Vertices)[iCandidateVertex];

		int iLoopCount = (*p_v_i_Vertices)[iCandidateVertex + 1];
		for(int j = (*p_v_i_Vertices)[iCandidateVertex]; j < iLoopCount; j++)
		{
			// Pruning 3
			if(maxClq <= ((*p_v_i_Vertices)[(*p_v_i_Edges)[j] + 1] - (*p_v_i_Vertices)[(*p_v_i_Edges)[j]]))
				v_i_S[iPos++] = (*p_v_i_Edges)[j];
		}

		icc = 0;
		
		while(iPos > 0)
		{
			int imdv1 = -1, imd1 = -1;

			icc++;

			// generate a random number x from 0 to iPos -1
			// aasign that imdv = x and imd = d(x)
			//imdv = v_i_S[rand() % iPos];
			imdv = v_i_S[iPos-1];
			imd = (*p_v_i_Vertices)[imdv + 1] - (*p_v_i_Vertices)[imdv];

			iPos1 = 0;

			for(int j = 0; j < iPos; j++)
			{
				iLoopCount = (*p_v_i_Vertices)[imdv + 1];
				for(int k = (*p_v_i_Vertices)[imdv]; k < iLoopCount; k++)
				{
					// Pruning 5
					if(v_i_S[j] == (*p_v_i_Edges)[k] && maxClq <= ((*p_v_i_Vertices)[(*p_v_i_Edges)[k] + 1] - (*p_v_i_Vertices)[(*p_v_i_Edges)[k]]))
					{
						v_i_S1[iPos1++] = v_i_S[j]; // calculate the max degree vertex here
						
						break;
					}
				}
			}

			for(int j = 0; j < iPos1; j++)
				v_i_S[j] = v_i_S1[j];
			
			iPos = iPos1;

			imdv = imdv1;
			imd = imd1;			
		}
	
		if(maxClq < icc)
			maxClq = icc;
			
	}

	return maxClq;
}